

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execShiftIm<(moira::Instr)14,(moira::Mode)11,(moira::Size)4>(Moira *this,u16 opcode)

{
  uint uVar1;
  uint cnt_00;
  ushort in_SI;
  long *in_RDI;
  int cnt;
  int dst;
  int src;
  u32 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 local_24;
  undefined2 in_stack_fffffffffffffff4;
  
  uVar1 = (int)(uint)in_SI >> 9 & 7;
  cnt_00 = in_SI & 7;
  local_24 = uVar1;
  if (uVar1 == 0) {
    local_24 = 8;
  }
  prefetch<4ul>((Moira *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  (**(code **)(*in_RDI + 200))(in_RDI,local_24 * 2 + 4);
  readD<(moira::Size)4>
            ((Moira *)CONCAT44(local_24,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
  shift<(moira::Instr)14,(moira::Size)4>
            ((Moira *)CONCAT26(in_SI,CONCAT24(in_stack_fffffffffffffff4,uVar1)),cnt_00,(u64)in_RDI);
  writeD<(moira::Size)4>
            ((Moira *)CONCAT44(local_24,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc,
             in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void
Moira::execShiftIm(u16 opcode)
{
    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);
    int cnt = src ? src : 8;

    prefetch<POLLIPL>();
    sync((S == Long ? 4 : 2) + 2 * cnt);

    writeD<S>(dst, shift<I,S>(cnt, readD<S>(dst)));
}